

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O0

void __thiscall Matrix3f::print(Matrix3f *this)

{
  float *in_RDI;
  
  printf("[ %.4f %.4f %.4f ]\n[ %.4f %.4f %.4f ]\n[ %.4f %.4f %.4f ]\n",(double)*in_RDI,
         (double)in_RDI[3],(double)in_RDI[6],(double)in_RDI[1],(double)in_RDI[4],(double)in_RDI[7],
         (double)in_RDI[2],(double)in_RDI[5]);
  return;
}

Assistant:

void Matrix3f::print()
{
	printf( "[ %.4f %.4f %.4f ]\n[ %.4f %.4f %.4f ]\n[ %.4f %.4f %.4f ]\n",
		m_elements[ 0 ], m_elements[ 3 ], m_elements[ 6 ],
		m_elements[ 1 ], m_elements[ 4 ], m_elements[ 7 ],
		m_elements[ 2 ], m_elements[ 5 ], m_elements[ 8 ] );
}